

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_functions.cpp
# Opt level: O2

void Am_Insert_JChar_At_Cursor(Am_Object *text,char c,bool advance_cursor)

{
  uint uVar1;
  byte bVar2;
  long lVar3;
  bool bVar4;
  byte bVar5;
  uint uVar6;
  int iVar7;
  Am_Value *pAVar8;
  byte *pbVar9;
  char *pcVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  Am_Object *this;
  ulong uVar14;
  Am_String old_str;
  Am_Object local_100;
  Am_Object local_f8;
  Am_Object local_f0;
  Am_Object local_e8;
  Am_Object local_e0;
  Am_Object local_d8;
  Am_Object local_d0;
  Am_Object local_c8;
  Am_Object local_c0;
  Am_Object local_b8;
  Am_Object local_b0;
  Am_Object local_a8;
  Am_Object local_a0;
  Am_Object local_98;
  Am_Object local_90;
  Am_Object local_88;
  Am_Object local_80;
  Am_Object local_78;
  Am_Object local_70;
  Am_Object local_68;
  Am_Object local_60;
  Am_Object local_58;
  Am_Object local_50;
  Am_Object local_48;
  Am_Object local_40;
  Am_Object local_38;
  
  pAVar8 = Am_Object::Get(text,0xad,0);
  uVar6 = Am_Value::operator_cast_to_int(pAVar8);
  Am_Object::Am_Object(&local_98,text);
  iVar7 = ml_head_pos(&local_98);
  Am_Object::~Am_Object(&local_98);
  if ((int)uVar6 < iVar7) {
    return;
  }
  pAVar8 = Am_Object::Get(text,0xe4,0);
  bVar4 = Am_Value::operator_cast_to_bool(pAVar8);
  if (bVar4) {
    Am_Object::Am_Object(&local_a0,text);
    Am_Delete_Entire_String(&local_a0);
    Am_Object::~Am_Object(&local_a0);
  }
  pAVar8 = Am_Object::Get(text,0xab,0);
  Am_String::Am_String(&old_str,pAVar8);
  pbVar9 = (byte *)Am_String::operator_cast_to_char_(&old_str);
  bVar2 = *pbVar9;
  uVar13 = iVar7 + 2;
  if (uVar6 < uVar13) {
    uVar13 = (int)c - 0x61;
    uVar6 = uVar13 >> 1;
    uVar13 = uVar6 | (uint)((uVar13 & 1) != 0) << 0x1f;
    if ((uVar13 < 0xb) && ((0x495U >> (uVar6 & 0x1f) & 1) != 0)) {
      lVar3 = *(long *)(&DAT_00285bd8 + (ulong)uVar13 * 8);
      this = &local_90;
      Am_Object::Am_Object(this,text);
      to_correct_code(rktab[0][lVar3],(bool)(bVar2 >> 7));
      Am_Insert_String_At_Cursor(this,to_correct_code::buf,advance_cursor);
    }
    else {
      this = &local_88;
      Am_Object::Am_Object(this,text);
      to_correct_code(onetotwo[c],(bool)(bVar2 >> 7));
      Am_Insert_String_At_Cursor(this,to_correct_code::buf,advance_cursor);
    }
  }
  else {
    uVar1 = uVar6 - 2;
    uVar11 = (int)c - 0x61;
    if (uVar11 < 0x19) {
      if ((0x104111U >> (uVar11 & 0x1f) & 1) != 0) goto LAB_001e41d1;
      if ((0x1000080U >> (uVar11 & 0x1f) & 1) == 0) {
        if (uVar11 == 0xd) {
          pcVar10 = Am_String::operator_cast_to_char_(&old_str);
          iVar7 = jcomp(pcVar10 + uVar1,onetotwo[0x6e]);
          if (iVar7 == 0) {
            Am_Object::Am_Object(&local_a8,text);
            Am_Delete_Char_Before_Cursor(&local_a8);
            Am_Object::~Am_Object(&local_a8);
            this = &local_38;
            Am_Object::Am_Object(this,text);
            to_correct_code(n_Japanese,(bool)(bVar2 >> 7));
            Am_Insert_String_At_Cursor(this,to_correct_code::buf,advance_cursor);
            goto LAB_001e4395;
          }
        }
        goto LAB_001e43eb;
      }
LAB_001e4231:
      bVar5 = (byte)(c + 0x9bU) >> 1 | (c + 0x9bU) * -0x80;
      if ((8 < bVar5) || ((0x125U >> (bVar5 & 0x1f) & 1) == 0)) {
        pcVar10 = Am_String::operator_cast_to_char_(&old_str);
        iVar7 = jcomp(pcVar10 + uVar1,onetotwo[(byte)c]);
        if (iVar7 == 0) {
          Am_Object::Am_Object(&local_c0,text);
          Am_Move_Cursor_Left(&local_c0);
          Am_Object::~Am_Object(&local_c0);
          Am_Object::Am_Object(&local_c8,text);
          to_correct_code(small_tsu,(bool)(bVar2 >> 7));
          Am_Insert_String_At_Cursor(&local_c8,to_correct_code::buf,true);
          Am_Object::~Am_Object(&local_c8);
          if (!advance_cursor) goto LAB_001e439d;
          this = &local_48;
          Am_Object::Am_Object(this,text);
          Am_Move_Cursor_Right(this);
          goto LAB_001e4395;
        }
      }
    }
    else {
LAB_001e43eb:
      pcVar10 = Am_String::operator_cast_to_char_(&old_str);
      iVar7 = jcomp(pcVar10 + uVar1,onetotwo[0x6e]);
      if (iVar7 == 0) {
        Am_Object::Am_Object(&local_b0,text);
        Am_Delete_Char_Before_Cursor(&local_b0);
        Am_Object::~Am_Object(&local_b0);
        Am_Object::Am_Object(&local_b8,text);
        to_correct_code(n_Japanese,(bool)(bVar2 >> 7));
        Am_Insert_String_At_Cursor(&local_b8,to_correct_code::buf,true);
        Am_Object::~Am_Object(&local_b8);
        this = &local_40;
        Am_Object::Am_Object(this,text);
        to_correct_code(onetotwo[c],(bool)(bVar2 >> 7));
        Am_Insert_String_At_Cursor(this,to_correct_code::buf,advance_cursor);
        goto LAB_001e4395;
      }
LAB_001e41d1:
      if (0xe6 < (byte)(c + 0x85U)) goto LAB_001e4231;
    }
    uVar12 = uVar11 >> 1 | (uint)((uVar11 & 1) != 0) << 0x1f;
    if ((uVar12 < 0xb) && ((0x495U >> (uVar11 >> 1 & 0x1f) & 1) != 0)) {
      uVar14 = (ulong)*(uint *)(&DAT_00285bac + (ulong)uVar12 * 4);
      pcVar10 = Am_String::operator_cast_to_char_(&old_str);
      iVar7 = jcomp(pcVar10 + uVar1,onetotwo[0x79]);
      if (iVar7 == 0) {
        if (uVar13 <= uVar1) {
          pcVar10 = Am_String::operator_cast_to_char_(&old_str);
          uVar6 = isalpha_2(pcVar10 + ((ulong)uVar6 - 4));
          if (0 < (int)uVar6) {
            Am_Object::Am_Object(&local_d0,text);
            Am_Delete_Char_Before_Cursor(&local_d0);
            Am_Object::~Am_Object(&local_d0);
            Am_Object::Am_Object(&local_d8,text);
            Am_Delete_Char_Before_Cursor(&local_d8);
            Am_Object::~Am_Object(&local_d8);
            this = &local_58;
            Am_Object::Am_Object(this,text);
            to_correct_code(*(char **)((ulong)uVar6 * 0x50 + 0x2f4ac8 + uVar14 * 8),
                            (bool)(bVar2 >> 7));
            Am_Insert_String_At_Cursor(this,to_correct_code::buf,advance_cursor);
            goto LAB_001e4395;
          }
        }
        Am_Object::Am_Object(&local_e0,text);
        Am_Delete_Char_Before_Cursor(&local_e0);
        Am_Object::~Am_Object(&local_e0);
        this = &local_60;
        Am_Object::Am_Object(this,text);
        to_correct_code(rktab[0x18][uVar14],(bool)(bVar2 >> 7));
        Am_Insert_String_At_Cursor(this,to_correct_code::buf,advance_cursor);
      }
      else {
        pcVar10 = Am_String::operator_cast_to_char_(&old_str);
        iVar7 = jcomp(pcVar10 + uVar1,onetotwo[0x68]);
        if (iVar7 == 0) {
          if (uVar13 <= uVar1) {
            pcVar10 = Am_String::operator_cast_to_char_(&old_str);
            uVar6 = isalpha_2(pcVar10 + ((ulong)uVar6 - 4));
            if (0 < (int)uVar6) {
              Am_Object::Am_Object(&local_e8,text);
              Am_Delete_Char_Before_Cursor(&local_e8);
              Am_Object::~Am_Object(&local_e8);
              Am_Object::Am_Object(&local_f0,text);
              Am_Delete_Char_Before_Cursor(&local_f0);
              Am_Object::~Am_Object(&local_f0);
              this = &local_68;
              Am_Object::Am_Object(this,text);
              to_correct_code(*(char **)((ulong)uVar6 * 0x50 + 0x2f4ac8 + uVar14 * 8),
                              (bool)(bVar2 >> 7));
              Am_Insert_String_At_Cursor(this,to_correct_code::buf,advance_cursor);
              goto LAB_001e4395;
            }
          }
          Am_Object::Am_Object(&local_f8,text);
          Am_Delete_Char_Before_Cursor(&local_f8);
          Am_Object::~Am_Object(&local_f8);
          this = &local_70;
          Am_Object::Am_Object(this,text);
          to_correct_code(rktab[7][uVar14],(bool)(bVar2 >> 7));
          Am_Insert_String_At_Cursor(this,to_correct_code::buf,advance_cursor);
        }
        else {
          pcVar10 = Am_String::operator_cast_to_char_(&old_str);
          uVar6 = isalpha_2(pcVar10 + uVar1);
          if ((int)uVar6 < 1) {
            this = &local_80;
            Am_Object::Am_Object(this,text);
            to_correct_code(rktab[0][uVar14],(bool)(bVar2 >> 7));
            Am_Insert_String_At_Cursor(this,to_correct_code::buf,advance_cursor);
          }
          else {
            Am_Object::Am_Object(&local_100,text);
            Am_Delete_Char_Before_Cursor(&local_100);
            Am_Object::~Am_Object(&local_100);
            this = &local_78;
            Am_Object::Am_Object(this,text);
            to_correct_code(rktab[uVar6][uVar14],(bool)(bVar2 >> 7));
            Am_Insert_String_At_Cursor(this,to_correct_code::buf,advance_cursor);
          }
        }
      }
    }
    else {
      this = &local_50;
      Am_Object::Am_Object(this,text);
      to_correct_code(onetotwo[c],(bool)(bVar2 >> 7));
      Am_Insert_String_At_Cursor(this,to_correct_code::buf,advance_cursor);
    }
  }
LAB_001e4395:
  Am_Object::~Am_Object(this);
LAB_001e439d:
  Am_String::~Am_String(&old_str);
  return;
}

Assistant:

void
Am_Insert_JChar_At_Cursor(Am_Object text, char c, bool advance_cursor)
{
  int cursor_index = text.Get(Am_CURSOR_INDEX);
  int head_pos = ml_head_pos(text);
  if (cursor_index >= head_pos) {
    if ((bool)text.Get(Am_PENDING_DELETE)) //delete all text first
      Am_Delete_Entire_String(text);
    Am_String old_str = text.Get(Am_TEXT);
    bool eucf = iseuc((const char *)old_str);
    if (cursor_index >= head_pos + 2) {
      cursor_index -= 2;
      if (c == 'n' &&
          jcomp(&((const char *)old_str)[cursor_index], onetotwo['n']) ==
              0) { // case 'nn'
        Am_Delete_Char_Before_Cursor(text);
        Am_Insert_String_At_Cursor(text, to_correct_code(n_Japanese, eucf),
                                   advance_cursor);
      } else if (!isboin(c) && c != 'h' && c != 'y' &&
                 jcomp(&((const char *)old_str)[cursor_index], onetotwo['n']) ==
                     0) { // case 'nt' etc.
        Am_Delete_Char_Before_Cursor(text);
        Am_Insert_String_At_Cursor(text, to_correct_code(n_Japanese, eucf),
                                   true);
        Am_Insert_String_At_Cursor(text, to_correct_code(onetotwo[c], eucf),
                                   advance_cursor);
      } else if (isshiin(c) &&
                 jcomp(&((const char *)old_str)[cursor_index], onetotwo[c]) ==
                     0) { // case 'tt' etc.
        Am_Move_Cursor_Left(text);
        Am_Insert_String_At_Cursor(text, to_correct_code(small_tsu, eucf),
                                   true);
        if (advance_cursor)
          Am_Move_Cursor_Right(text);
      } else { // not 'nn', 'tt' etc.
        int boin, shiin;
        switch (c) {
        case 'a':
          boin = 0;
          break;
        case 'i':
          boin = 1;
          break;
        case 'u':
          boin = 2;
          break;
        case 'e':
          boin = 3;
          break;
        case 'o':
          boin = 4;
          break;
        default: // case only Shiin
          Am_Insert_String_At_Cursor(text, to_correct_code(onetotwo[c], eucf),
                                     advance_cursor);
          return;
        }
        if (jcomp(&((const char *)old_str)[cursor_index], onetotwo['y']) == 0) {
          if (cursor_index >= head_pos + 2 &&
              (shiin = isalpha_2(&((const char *)old_str)[cursor_index - 2])) >
                  0) { //case 'kya' etc.
            Am_Delete_Char_Before_Cursor(text);
            Am_Delete_Char_Before_Cursor(text);
            Am_Insert_String_At_Cursor(
                text, to_correct_code(rktab[shiin][boin + 5], eucf),
                advance_cursor);
          } else { // two alphabets in 'y' case
            Am_Delete_Char_Before_Cursor(text);
            Am_Insert_String_At_Cursor(
                text, to_correct_code(rktab['y' - 'a'][boin], eucf),
                advance_cursor);
          }
        } else if (jcomp(&((const char *)old_str)[cursor_index],
                         onetotwo['h']) == 0) { // case 'kha' etc.
          if (cursor_index >= head_pos + 2 &&
              (shiin = isalpha_2(&((const char *)old_str)[cursor_index - 2])) >
                  0) {
            Am_Delete_Char_Before_Cursor(text);
            Am_Delete_Char_Before_Cursor(text);
            Am_Insert_String_At_Cursor(
                text, to_correct_code(rktab[shiin][boin + 5], eucf),
                advance_cursor);
          } else { // two alphabets in 'h' case
            Am_Delete_Char_Before_Cursor(text);
            Am_Insert_String_At_Cursor(
                text, to_correct_code(rktab['h' - 'a'][boin], eucf),
                advance_cursor);
          }
        } else { // without 'h', 'y'
          if ((shiin = isalpha_2(&((const char *)old_str)[cursor_index])) >
              0) { // case 'ka' etc.
            Am_Delete_Char_Before_Cursor(text);
            Am_Insert_String_At_Cursor(
                text, to_correct_code(rktab[shiin][boin], eucf),
                advance_cursor);
          } else { // case Boin only, such as 'a' etc.
            Am_Insert_String_At_Cursor(
                text, to_correct_code(rktab[0][boin], eucf), advance_cursor);
          }
        }
      }
    } else { // insert to the head of input field
      int boin;
      switch (c) {
      case 'a':
        boin = 0;
        break;
      case 'i':
        boin = 1;
        break;
      case 'u':
        boin = 2;
        break;
      case 'e':
        boin = 3;
        break;
      case 'o':
        boin = 4;
        break;
      default: // case only Shiin
        Am_Insert_String_At_Cursor(text, to_correct_code(onetotwo[c], eucf),
                                   advance_cursor);
        return;
      }
      Am_Insert_String_At_Cursor(text, to_correct_code(rktab[0][boin], eucf),
                                 advance_cursor);
    }
  }
}